

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>_>::
clone_impl(clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>_>
           *this,error_info_injector<boost::asio::service_already_exists> *x)

{
  error_info_container *peVar1;
  char *pcVar2;
  
  *(undefined ***)&this->field_0x38 = &PTR___cxa_pure_virtual_00125e78;
  std::logic_error::logic_error((logic_error *)this,(logic_error *)x);
  *(undefined ***)
   &(this->super_error_info_injector<boost::asio::service_already_exists>).
    super_service_already_exists = &PTR__logic_error_00126238;
  (this->super_error_info_injector<boost::asio::service_already_exists>).super_exception.
  _vptr_exception = (_func_int **)&PTR___cxa_pure_virtual_00125ef0;
  peVar1 = (x->super_exception).data_.px_;
  (this->super_error_info_injector<boost::asio::service_already_exists>).super_exception.data_.px_ =
       peVar1;
  if (peVar1 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar1 + 0x18))();
  }
  (this->super_error_info_injector<boost::asio::service_already_exists>).super_exception.throw_line_
       = (x->super_exception).throw_line_;
  pcVar2 = (x->super_exception).throw_file_;
  (this->super_error_info_injector<boost::asio::service_already_exists>).super_exception.
  throw_function_ = (x->super_exception).throw_function_;
  (this->super_error_info_injector<boost::asio::service_already_exists>).super_exception.throw_file_
       = pcVar2;
  *(undefined8 *)
   &(this->super_error_info_injector<boost::asio::service_already_exists>).
    super_service_already_exists = 0x126150;
  (this->super_error_info_injector<boost::asio::service_already_exists>).super_exception.
  _vptr_exception = (_func_int **)0x126188;
  *(undefined8 *)&this->field_0x38 = 0x1261c0;
  copy_boost_exception
            (&(this->super_error_info_injector<boost::asio::service_already_exists>).super_exception
             ,&x->super_exception);
  return;
}

Assistant:

explicit
            clone_impl( T const & x ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }